

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O1

bool Grammar::is_keyword_message_part(string *str)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  byte unaff_BPL;
  bool bVar4;
  bool bVar5;
  string local_88;
  string local_68;
  string local_48;
  
  uVar2 = (uint)str->_M_string_length;
  bVar4 = 0 < (int)uVar2;
  if (0 < (int)uVar2) {
    uVar3 = 1;
    do {
      cVar1 = (str->_M_dataplus)._M_p[uVar3 - 1];
      if ((cVar1 == '?') || (cVar1 == ':')) {
        std::__cxx11::string::substr((ulong)&local_48,(ulong)str);
        bVar5 = is_keyword_message_token(&local_48);
        if (bVar5) {
          std::__cxx11::string::substr((ulong)&local_88,(ulong)str);
          str_utils::ltrim(&local_68,&local_88);
          unaff_BPL = is_keyword_message_argument(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
        }
        else {
          unaff_BPL = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        break;
      }
      bVar4 = uVar3 < (uVar2 & 0x7fffffff);
      bVar5 = uVar3 != (uVar2 & 0x7fffffff);
      uVar3 = uVar3 + 1;
    } while (bVar5);
  }
  return (bool)(bVar4 & unaff_BPL);
}

Assistant:

bool Grammar::is_keyword_message_part(const std::string& str) {
    for (int i = 0; i < int(str.size()); i++)
        if (str[i] == ':' || str[i] == '?')
            return is_keyword_message_token(str.substr(0, i + 1)) &&
                   is_keyword_message_argument(str_utils::ltrim(str.substr(i + 1)));
    return false;
}